

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::SimpleAssignmentPatternExpression::forFixedArray
          (SimpleAssignmentPatternExpression *this,Compilation *comp,
          SimpleAssignmentPatternSyntax *syntax,ASTContext *context,Type *type,Type *elementType,
          bitwidth_t numElements,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  undefined4 in_stack_0000000c;
  SourceRange *args_2;
  SimpleAssignmentPatternExpression *result;
  undefined1 local_50 [8];
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elems;
  bool bad;
  bitwidth_t numElements_local;
  Type *elementType_local;
  Type *type_local;
  ASTContext *context_local;
  SimpleAssignmentPatternSyntax *syntax_local;
  Compilation *comp_local;
  
  args_2 = (SourceRange *)&numElements;
  elems.size_._4_4_ = SUB84(elementType,0);
  elems.size_._3_1_ = 0;
  sourceRange_00.endLoc = (SourceLocation)((long)&elems.size_ + 3);
  sourceRange_00.startLoc = sourceRange.startLoc;
  _local_50 = bindExpressionList((ast *)context,type,(Type *)0x1,(ulong)elementType & 0xffffffff,
                                 (int)comp + 0x20,
                                 (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)syntax,
                                 (ASTContext *)CONCAT44(in_stack_0000000c,numElements),
                                 sourceRange_00,(bool *)args_2);
  comp_local = (Compilation *)
               BumpAllocator::
               emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
                         ((BumpAllocator *)this,(Type *)context,
                          (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          local_50,args_2);
  if ((elems.size_._3_1_ & 1) != 0) {
    comp_local = (Compilation *)Expression::badExpr((Compilation *)this,(Expression *)comp_local);
  }
  return (Expression *)comp_local;
}

Assistant:

Expression& SimpleAssignmentPatternExpression::forFixedArray(
    Compilation& comp, const SimpleAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, bitwidth_t numElements, SourceRange sourceRange) {

    bool bad = false;
    auto elems = bindExpressionList(type, elementType, 1, numElements, syntax.items, context,
                                    sourceRange, bad);

    auto result = comp.emplace<SimpleAssignmentPatternExpression>(type, elems, sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}